

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

int sort_rooms_standard_comp(void *va,void *vb)

{
  sort_rooms_data *b;
  sort_rooms_data *a;
  void *vb_local;
  void *va_local;
  
  if (*(int *)((long)va + 4) == *(int *)((long)vb + 4)) {
    va_local._4_4_ = *(int *)((long)va + 8) - *(int *)((long)vb + 8);
  }
  else {
    va_local._4_4_ = *(int *)((long)va + 4) - *(int *)((long)vb + 4);
  }
  return va_local._4_4_;
}

Assistant:

static int sort_rooms_standard_comp(const void *va, const void *vb)
{
	const struct sort_rooms_data *a, *b;
	a = (const struct sort_rooms_data *)va;
	b = (const struct sort_rooms_data *)vb;
	if (a->lx != b->lx)
		return a->lx - b->lx;
	return a->ly - b->ly;
}